

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::http::http
          (http *this,service *srv,string *ip,int port,
          shared_ptr<cppcms::impl::cgi::http_watchdog> *wd,
          shared_ptr<cppcms::impl::url_rewriter> *rw)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  service *psVar3;
  cached_settings *pcVar4;
  
  connection::connection(&this->super_connection,srv);
  (this->super_connection)._vptr_connection = (_func_int **)&PTR__http_0028dd48;
  psVar3 = cppcms::service::impl(srv);
  booster::aio::stream_socket::stream_socket
            (&this->socket_,
             (psVar3->io_service_)._M_t.
             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
             .super__Head_base<0UL,_booster::aio::io_service_*,_false>._M_head_impl);
  *(undefined8 *)
   ((long)&(this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cppcms::http::impl::parser::parser(&this->input_parser_,&this->input_body_,&this->input_body_ptr_)
  ;
  (this->response_headers_)._M_dataplus._M_p = (pointer)&(this->response_headers_).field_2;
  (this->response_headers_)._M_string_length = 0;
  (this->response_headers_).field_2._M_local_buf[0] = '\0';
  this->sync_option_is_set_ = false;
  this->in_watchdog_ = false;
  this->eof_callback_ = false;
  (this->chunked_header_)._M_dataplus._M_p = (pointer)&(this->chunked_header_).field_2;
  (this->chunked_header_)._M_string_length = 0;
  (this->chunked_header_).field_2._M_local_buf[0] = '\0';
  (this->watchdog_).super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (wd->super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var1 = (wd->super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->watchdog_).super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->rewrite_).super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (rw->super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (rw->super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->rewrite_).super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  pcVar2 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ip_,pcVar2,pcVar2 + ip->_M_string_length);
  (this->remote_ip_)._M_dataplus._M_p = (pointer)&(this->remote_ip_).field_2;
  (this->remote_ip_)._M_string_length = 0;
  (this->remote_ip_).field_2._M_local_buf[0] = '\0';
  this->port_ = port;
  pcVar4 = cppcms::service::cached_settings(srv);
  this->timeout_ = (pcVar4->http).timeout;
  (*(this->super_connection)._vptr_connection[0xd])(this);
  return;
}

Assistant:

http(	cppcms::service &srv,
			std::string const &ip,
			int port,
			booster::shared_ptr<http_watchdog> wd,
			booster::shared_ptr<url_rewriter> rw
			) 
		:
			connection(srv),
			socket_(srv.impl().get_io_service()),
			input_body_ptr_(0),
			input_parser_(input_body_,input_body_ptr_),
			sync_option_is_set_(false),
			in_watchdog_(false),
			eof_callback_(false),
			watchdog_(wd),
			rewrite_(rw),
			ip_(ip),
			port_(port)
		{
			timeout_ = srv.cached_settings().http.timeout;
			reset_all();
		}